

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_artifact_set_values(parser *p)

{
  long lVar1;
  errr eVar2;
  errr eVar3;
  void *pvVar4;
  char *pcVar5;
  parser_error pVar6;
  wchar_t index;
  wchar_t value;
  char *local_40;
  long local_38;
  
  pvVar4 = parser_priv(p);
  lVar1 = *(long *)((long)pvVar4 + 0x20);
  if (lVar1 == 0) {
    __assert_fail("e",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                  ,0xd5a,"enum parser_error parse_artifact_set_values(struct parser *)");
  }
  pcVar5 = parser_getstr(p,"values");
  local_40 = string_make(pcVar5);
  pcVar5 = strtok(local_40," |");
  local_38 = lVar1;
  do {
    if (pcVar5 == (char *)0x0) {
      pVar6 = PARSE_ERROR_NONE;
LAB_00198c9c:
      mem_free(local_40);
      return pVar6;
    }
    value = L'\0';
    index = L'\0';
    eVar2 = grab_int_value((int16_t *)(lVar1 + 0x12),obj_mods,pcVar5);
    eVar3 = grab_index_and_int(&value,&index,element_names,"RES_",pcVar5);
    if (eVar3 == 0) {
      *(short *)(local_38 + 0x34 + (long)index * 4) = 100 - (short)value;
    }
    else if (eVar2 != 0) {
      pVar6 = PARSE_ERROR_INVALID_VALUE;
      goto LAB_00198c9c;
    }
    pcVar5 = strtok((char *)0x0," |");
  } while( true );
}

Assistant:

static enum parser_error parse_artifact_set_values(struct parser *p) {
	struct artifact_set *set = parser_priv(p);
	struct set_item *e = set->set_item;
	char *s;
	char *t;
	assert(set);
	assert(e);

	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		int value = 0;
		int index = 0;
		if (!grab_int_value(e->modifiers, obj_mods, t))
			found = true;
		if (!grab_index_and_int(&value, &index, element_names, "RES_", t)) {
			found = true;
			e->el_info[index].res_level = RES_LEVEL_BASE - value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	mem_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}